

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,cs_impl::any::baseHolder*>
          (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this,
          int *args,baseHolder **args_1)

{
  baseHolder *pbVar1;
  __int_type_conflict _Var2;
  proxy *__args;
  proxy *in_RDX;
  new_allocator<cs_impl::any::proxy> *in_RSI;
  baseHolder **in_RDI;
  proxy *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x201] != (baseHolder *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      pbVar1 = in_RDI[0x201];
      in_RDI[0x201] = (baseHolder *)((long)&pbVar1[-1]._vptr_baseHolder + 7);
      __args = (proxy *)in_RDI[(long)((long)&pbVar1[-1]._vptr_baseHolder + 7)];
      goto LAB_00217ac4;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::proxy>::allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_00217ac4:
  __gnu_cxx::new_allocator<cs_impl::any::proxy>::
  construct<cs_impl::any::proxy,int,cs_impl::any::baseHolder*>(in_RSI,in_RDX,(int *)__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}